

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O1

void BinaryenModuleOptimize(BinaryenModuleRef module)

{
  undefined1 local_128 [88];
  __node_base_ptr *local_d0;
  size_type local_c8;
  __node_base local_c0;
  size_type sStack_b8;
  float local_b0;
  size_t local_a8;
  __node_base_ptr p_Stack_a0;
  __node_base_ptr *local_98;
  size_type local_90;
  __node_base local_88;
  size_type sStack_80;
  float local_78;
  size_t local_70;
  __node_base_ptr p_Stack_68;
  element_type *local_60;
  undefined1 auStack_58 [16];
  __node_base_ptr *local_48;
  size_type local_40;
  __node_base local_38;
  size_type sStack_30;
  float local_28;
  size_t local_20;
  __node_base_ptr p_Stack_18;
  
  local_128._0_8_ = &PTR__PassRunner_00d875f8;
  local_128._16_8_ = &module->allocator;
  local_128._24_8_ = (pointer)0x0;
  local_128[0x20] = 0;
  local_128._33_7_ = 0;
  local_128[0x28] = 0;
  local_128._41_7_ = 0;
  local_d0 = &p_Stack_a0;
  local_c8 = 1;
  local_c0._M_nxt = (_Hash_node_base *)0x0;
  sStack_b8 = 0;
  local_b0 = 1.0;
  local_a8 = 0;
  p_Stack_a0 = (__node_base_ptr)0x0;
  local_98 = &p_Stack_68;
  local_90 = 1;
  local_88._M_nxt = (_Hash_node_base *)0x0;
  sStack_80 = 0;
  local_78 = 1.0;
  local_48 = &p_Stack_18;
  local_60 = (element_type *)0x0;
  auStack_58._0_7_ = 0;
  auStack_58._7_4_ = 0;
  local_70 = 0;
  p_Stack_68 = (__node_base_ptr)0x0;
  local_40 = 1;
  local_38._M_nxt = (_Hash_node_base *)0x0;
  sStack_30 = 0;
  local_28 = 1.0;
  local_20 = 0;
  p_Stack_18 = (__node_base_ptr)0x0;
  local_128[0x30] = globalPassOptions.debug;
  local_128._49_2_ = globalPassOptions._1_2_;
  local_128[0x33] = globalPassOptions._3_1_;
  local_128._52_4_ = globalPassOptions.optimizeLevel;
  local_128._56_4_ = globalPassOptions.shrinkLevel;
  local_128._60_4_ = globalPassOptions.inlining.alwaysInlineMaxSize;
  local_128._64_4_ = globalPassOptions.inlining.oneCallerInlineMaxSize;
  local_128._68_4_ = globalPassOptions.inlining.flexibleInlineMaxSize;
  local_128._72_4_ = globalPassOptions.inlining._12_4_;
  local_128._76_4_ = globalPassOptions.inlining.partialInliningIfs;
  local_128._80_4_ = globalPassOptions._32_4_;
  local_128._84_4_ = globalPassOptions._36_4_;
  local_128._8_8_ = module;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::
  _M_assign_elements<std::_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)&local_d0,&globalPassOptions.arguments._M_h);
  std::
  _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
  ::
  _M_assign_elements<std::_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>const&>
            ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
              *)&local_98,&globalPassOptions.passesToSkip._M_h);
  local_60 = globalPassOptions.funcEffectsMap.
             super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)auStack_58,
             &globalPassOptions.funcEffectsMap.
              super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  wasm::PassRunner::addDefaultOptimizationPasses((PassRunner *)local_128);
  wasm::PassRunner::run((PassRunner *)local_128);
  wasm::PassRunner::~PassRunner((PassRunner *)local_128);
  return;
}

Assistant:

void BinaryenModuleOptimize(BinaryenModuleRef module) {
  PassRunner passRunner((Module*)module);
  passRunner.options = globalPassOptions;
  passRunner.addDefaultOptimizationPasses();
  passRunner.run();
}